

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O2

void __thiscall wasm::Pass::~Pass(Pass *this)

{
  this->_vptr_Pass = (_func_int **)&PTR__Pass_00207478;
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&this->passArg);
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

virtual ~Pass() = default;